

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O2

void __thiscall ipx::ForrestTomlin::ComputeEta(ForrestTomlin *this,Int j)

{
  double dVar1;
  double dVar2;
  pointer piVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  double local_30;
  
  piVar3 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (ulong)((long)(this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar3) >> 2;
  iVar5 = (this->colperm_inv_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[j];
  uVar4 = 0;
  iVar7 = (int)uVar8;
  uVar6 = 0;
  if (0 < iVar7) {
    uVar6 = uVar8 & 0xffffffff;
  }
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    if (piVar3[uVar4] == iVar5) {
      iVar5 = this->dim_ + (int)uVar4;
    }
  }
  local_30 = 0.0;
  std::valarray<double>::operator=(&this->work_,&local_30);
  lVar9 = (long)iVar5;
  (this->work_)._M_data[lVar9] = 1.0;
  TriangularSolve(&this->U_,&this->work_,'t',"upper",0);
  SparseMatrix::clear_queue(&this->R_);
  dVar1 = (this->work_)._M_data[lVar9];
  while (lVar9 = lVar9 + 1, lVar9 < (long)this->dim_ + (long)iVar7) {
    dVar2 = (this->work_)._M_data[lVar9];
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      SparseMatrix::push_back(&this->R_,(Int)lVar9,-dVar2 / dVar1);
    }
  }
  this->have_btran_ = true;
  this->replace_next_ = iVar5;
  return;
}

Assistant:

void ForrestTomlin::ComputeEta(Int j) {
    Int num_updates = replaced_.size();
    assert(U_.cols() == dim_+num_updates);

    // Find permuted position of j.
    Int pos = colperm_inv_[j];
    for (Int k = 0; k < num_updates; k++)
        if (replaced_[k] == pos)
            pos = dim_+k;

    // Solve lhs'U=e_pos'. Replaced position must remain zero (by the fact that
    // the corresponding columns of U are unit), so replaced indices cannot
    // occur in the new eta matrix.
    work_ = 0.0;
    work_[pos] = 1.0;
    TriangularSolve(U_, work_, 't', "upper", 0);
    #ifndef NDEBUG
    for (Int k = 0; k < num_updates; k++)
        assert(work_[replaced_[k]] == 0.0);
    #endif

    // Queue eta at end of R. Indices are sorted, which is required for the
    // sparse dot product in Update().
    R_.clear_queue();
    double pivot = work_[pos];
    for (Int i = pos+1; i < dim_+num_updates; i++) {
        if (work_[i] != 0.0)
            R_.push_back(i, -work_[i]/pivot);
    }
    have_btran_ = true;
    replace_next_ = pos;
}